

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomPointF::write(DomPointF *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  char16_t *pcVar2;
  uint uVar3;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar4;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  long in_FS_OFFSET;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  aVar5._4_4_ = in_register_00000034;
  aVar5._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)((long)__buf + 0x10);
  if (lVar1 == 0) {
    local_50.d = (Data *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_68.size = 0;
    local_50.ptr = L"pointf";
    local_50.size = 6;
  }
  else {
    QString::toLower_helper((QString *)&local_50);
  }
  QVar6.m_size = (size_t)local_50.ptr;
  QVar6.field_0.m_data = aVar5.m_data;
  QXmlStreamWriter::writeStartElement(QVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (lVar1 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  uVar3 = this->m_children;
  if ((uVar3 & 1) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"x",1);
    pcVar2 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number(this->m_x,(char)&local_80,0x66);
    QVar7.m_size = (size_t)pcVar2;
    QVar7.field_0.m_data = aVar5.m_data;
    QVar9.m_size = (size_t)local_80.ptr;
    QVar9.field_0.m_data = aVar4.m_data;
    QXmlStreamWriter::writeTextElement(QVar7,QVar9);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar3 = this->m_children;
  }
  if ((uVar3 & 2) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"y",1);
    pcVar2 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number(this->m_y,(char)&local_80,0x66);
    QVar8.m_size = (size_t)pcVar2;
    QVar8.field_0.m_data = aVar5.m_data;
    QVar10.m_size = (size_t)local_80.ptr;
    QVar10.field_0.m_data = aVar4.m_data;
    QXmlStreamWriter::writeTextElement(QVar8,QVar10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomPointF::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("pointf") : tagName.toLower());

    if (m_children & X)
        writer.writeTextElement(u"x"_s, QString::number(m_x, 'f', 15));

    if (m_children & Y)
        writer.writeTextElement(u"y"_s, QString::number(m_y, 'f', 15));

    writer.writeEndElement();
}